

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_http_location.c
# Opt level: O3

void test_location_callback_test(void)

{
  _Bool _Var1;
  cio_http_location_handler handler;
  cio_http_location_handler local_78;
  
  cio_http_location_handler_init(&local_78);
  _Var1 = cio_http_location_handler_no_callbacks(&local_78);
  if (!_Var1) {
    UnityFail("cio_http_location_handler_no_callbacks did not return true if no handler was set!",
              0x75);
  }
  cio_http_location_handler_init(&local_78);
  local_78.on_url = data_cb;
  _Var1 = cio_http_location_handler_no_callbacks(&local_78);
  if (_Var1) {
    UnityFail("cio_http_location_handler_no_callbacks did not return false if a handler was set!",
              0x79);
  }
  cio_http_location_handler_init(&local_78);
  local_78.on_body = data_cb;
  _Var1 = cio_http_location_handler_no_callbacks(&local_78);
  if (_Var1) {
    UnityFail("cio_http_location_handler_no_callbacks did not return false if a handler was set!",
              0x7d);
  }
  cio_http_location_handler_init(&local_78);
  local_78.on_host = data_cb;
  _Var1 = cio_http_location_handler_no_callbacks(&local_78);
  if (_Var1) {
    UnityFail("cio_http_location_handler_no_callbacks did not return false if a handler was set!",
              0x81);
  }
  cio_http_location_handler_init(&local_78);
  local_78.on_path = data_cb;
  _Var1 = cio_http_location_handler_no_callbacks(&local_78);
  if (_Var1) {
    UnityFail("cio_http_location_handler_no_callbacks did not return false if a handler was set!",
              0x85);
  }
  cio_http_location_handler_init(&local_78);
  local_78.on_port = data_cb;
  _Var1 = cio_http_location_handler_no_callbacks(&local_78);
  if (_Var1) {
    UnityFail("cio_http_location_handler_no_callbacks did not return false if a handler was set!",
              0x89);
  }
  cio_http_location_handler_init(&local_78);
  local_78.on_query = data_cb;
  _Var1 = cio_http_location_handler_no_callbacks(&local_78);
  if (_Var1) {
    UnityFail("cio_http_location_handler_no_callbacks did not return false if a handler was set!",
              0x8d);
  }
  cio_http_location_handler_init(&local_78);
  local_78.on_schema = data_cb;
  _Var1 = cio_http_location_handler_no_callbacks(&local_78);
  if (!_Var1) {
    cio_http_location_handler_init(&local_78);
    local_78.on_fragment = data_cb;
    _Var1 = cio_http_location_handler_no_callbacks(&local_78);
    if (_Var1) {
      UnityFail("cio_http_location_handler_no_callbacks did not return false if a handler was set!",
                0x95);
    }
    cio_http_location_handler_init(&local_78);
    local_78.on_header_field_name = data_cb;
    _Var1 = cio_http_location_handler_no_callbacks(&local_78);
    if (_Var1) {
      UnityFail("cio_http_location_handler_no_callbacks did not return false if a handler was set!",
                0x99);
    }
    cio_http_location_handler_init(&local_78);
    local_78.on_header_field_value = data_cb;
    _Var1 = cio_http_location_handler_no_callbacks(&local_78);
    if (_Var1) {
      UnityFail("cio_http_location_handler_no_callbacks did not return false if a handler was set!",
                0x9d);
    }
    cio_http_location_handler_init(&local_78);
    local_78.on_headers_complete = no_data_cb;
    _Var1 = cio_http_location_handler_no_callbacks(&local_78);
    if (!_Var1) {
      cio_http_location_handler_init(&local_78);
      local_78.on_message_complete = no_data_cb;
      _Var1 = cio_http_location_handler_no_callbacks(&local_78);
      if (!_Var1) {
        return;
      }
      UnityFail("cio_http_location_handler_no_callbacks did not return false if a handler was set!",
                0xa5);
    }
    UnityFail("cio_http_location_handler_no_callbacks did not return false if a handler was set!",
              0xa1);
  }
  UnityFail("cio_http_location_handler_no_callbacks did not return false if a handler was set!",0x91
           );
}

Assistant:

static void test_location_callback_test(void)
{
	struct cio_http_location_handler handler;
	cio_http_location_handler_init(&handler);
	TEST_ASSERT_TRUE_MESSAGE(cio_http_location_handler_no_callbacks(&handler), "cio_http_location_handler_no_callbacks did not return true if no handler was set!");

	cio_http_location_handler_init(&handler);
	handler.on_url = data_cb;
	TEST_ASSERT_FALSE_MESSAGE(cio_http_location_handler_no_callbacks(&handler), "cio_http_location_handler_no_callbacks did not return false if a handler was set!");

	cio_http_location_handler_init(&handler);
	handler.on_body = data_cb;
	TEST_ASSERT_FALSE_MESSAGE(cio_http_location_handler_no_callbacks(&handler), "cio_http_location_handler_no_callbacks did not return false if a handler was set!");

	cio_http_location_handler_init(&handler);
	handler.on_host = data_cb;
	TEST_ASSERT_FALSE_MESSAGE(cio_http_location_handler_no_callbacks(&handler), "cio_http_location_handler_no_callbacks did not return false if a handler was set!");

	cio_http_location_handler_init(&handler);
	handler.on_path = data_cb;
	TEST_ASSERT_FALSE_MESSAGE(cio_http_location_handler_no_callbacks(&handler), "cio_http_location_handler_no_callbacks did not return false if a handler was set!");

	cio_http_location_handler_init(&handler);
	handler.on_port = data_cb;
	TEST_ASSERT_FALSE_MESSAGE(cio_http_location_handler_no_callbacks(&handler), "cio_http_location_handler_no_callbacks did not return false if a handler was set!");

	cio_http_location_handler_init(&handler);
	handler.on_query = data_cb;
	TEST_ASSERT_FALSE_MESSAGE(cio_http_location_handler_no_callbacks(&handler), "cio_http_location_handler_no_callbacks did not return false if a handler was set!");

	cio_http_location_handler_init(&handler);
	handler.on_schema = data_cb;
	TEST_ASSERT_FALSE_MESSAGE(cio_http_location_handler_no_callbacks(&handler), "cio_http_location_handler_no_callbacks did not return false if a handler was set!");

	cio_http_location_handler_init(&handler);
	handler.on_fragment = data_cb;
	TEST_ASSERT_FALSE_MESSAGE(cio_http_location_handler_no_callbacks(&handler), "cio_http_location_handler_no_callbacks did not return false if a handler was set!");

	cio_http_location_handler_init(&handler);
	handler.on_header_field_name = data_cb;
	TEST_ASSERT_FALSE_MESSAGE(cio_http_location_handler_no_callbacks(&handler), "cio_http_location_handler_no_callbacks did not return false if a handler was set!");

	cio_http_location_handler_init(&handler);
	handler.on_header_field_value = data_cb;
	TEST_ASSERT_FALSE_MESSAGE(cio_http_location_handler_no_callbacks(&handler), "cio_http_location_handler_no_callbacks did not return false if a handler was set!");

	cio_http_location_handler_init(&handler);
	handler.on_headers_complete = no_data_cb;
	TEST_ASSERT_FALSE_MESSAGE(cio_http_location_handler_no_callbacks(&handler), "cio_http_location_handler_no_callbacks did not return false if a handler was set!");

	cio_http_location_handler_init(&handler);
	handler.on_message_complete = no_data_cb;
	TEST_ASSERT_FALSE_MESSAGE(cio_http_location_handler_no_callbacks(&handler), "cio_http_location_handler_no_callbacks did not return false if a handler was set!");
}